

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCameraSceneNode.cpp
# Opt level: O1

void __thiscall
irr::scene::CCameraSceneNode::CCameraSceneNode
          (CCameraSceneNode *this,ISceneNode *parent,ISceneManager *mgr,s32 id,vector3df *position,
          vector3df *lookat)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  uint *puVar5;
  vector3df local_48;
  vector3df local_38;
  long *plVar3;
  
  *(undefined ***)&this->field_0x288 = &PTR__IReferenceCounted_00261738;
  plVar3 = (long *)0x0;
  *(undefined8 *)&this->field_0x290 = 0;
  *(undefined4 *)&this->field_0x298 = 1;
  local_38.X = 0.0;
  local_38.Y = 0.0;
  local_38.Z = 0.0;
  local_48.X = 1.0;
  local_48.Y = 1.0;
  local_48.Z = 1.0;
  ISceneNode::ISceneNode
            ((ISceneNode *)this,&PTR_construction_vtable_24__00263e28,parent,mgr,id,position,
             &local_38,&local_48);
  (this->super_ICameraSceneNode).super_ISceneNode._vptr_ISceneNode = (_func_int **)0x263e60;
  *(undefined8 *)&this->field_0x288 = 0x264060;
  *(undefined8 *)&(this->super_ICameraSceneNode).super_ISceneNode.field_0xe0 = 0x264440;
  (this->super_ICameraSceneNode).super_ISceneNode.field_0xe8 = 0;
  (this->super_ICameraSceneNode).super_ISceneNode._vptr_ISceneNode = (_func_int **)0x263be0;
  *(undefined8 *)&this->field_0x288 = 0x263e08;
  *(undefined8 *)&(this->super_ICameraSceneNode).super_ISceneNode.field_0xe0 = 0x263dd8;
  *(undefined8 *)&(this->super_ICameraSceneNode).super_ISceneNode.field_0xec = 0;
  *(undefined8 *)&(this->super_ICameraSceneNode).super_ISceneNode.field_0xf4 = 0;
  *(undefined8 *)&(this->super_ICameraSceneNode).field_0xfc = 0;
  *(undefined8 *)&(this->super_ICameraSceneNode).field_0x104 = *(undefined8 *)lookat;
  *(float *)&this->field_0x10c = lookat->Z;
  (this->UpVector).X = 0.0;
  (this->UpVector).Y = 1.0;
  (this->UpVector).Z = 0.0;
  this->ZNear = 1.0;
  this->ZFar = 3000.0;
  SViewFrustum::SViewFrustum(&this->ViewArea);
  (this->Affector).M[0xc] = 0.0;
  (this->Affector).M[0xd] = 0.0;
  (this->Affector).M[0xe] = 0.0;
  (this->Affector).M[0xf] = 0.0;
  (this->Affector).M[8] = 0.0;
  (this->Affector).M[9] = 0.0;
  (this->Affector).M[10] = 0.0;
  (this->Affector).M[0xb] = 0.0;
  (this->Affector).M[4] = 0.0;
  (this->Affector).M[5] = 0.0;
  (this->Affector).M[6] = 0.0;
  (this->Affector).M[7] = 0.0;
  (this->Affector).M[0] = 0.0;
  (this->Affector).M[1] = 0.0;
  (this->Affector).M[2] = 0.0;
  (this->Affector).M[3] = 0.0;
  (this->Affector).M[0xf] = 1.0;
  (this->Affector).M[10] = 1.0;
  (this->Affector).M[5] = 1.0;
  (this->Affector).M[0] = 1.0;
  this->InputReceiverEnabled = true;
  this->TargetAndRotationAreBound = false;
  this->Fovy = 1.2566371;
  this->Aspect = 1.3333334;
  if (mgr != (ISceneManager *)0x0) {
    iVar2 = (*mgr->_vptr_ISceneManager[2])(mgr);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  }
  if (plVar3 != (long *)0x0) {
    lVar4 = (**(code **)(*plVar3 + 0x1e0))(plVar3);
    if (*(int *)(lVar4 + 4) != 0) {
      puVar5 = (uint *)(**(code **)(*plVar3 + 0x1e0))(plVar3);
      uVar1 = *puVar5;
      lVar4 = (**(code **)(*plVar3 + 0x1e0))(plVar3);
      this->Aspect = (f32)((float)uVar1 / (float)*(uint *)(lVar4 + 4));
    }
  }
  (this->ViewArea).FarNearDistance = (float)this->ZFar - (float)this->ZNear;
  recalculateProjectionMatrix(this);
  recalculateViewArea(this);
  return;
}

Assistant:

CCameraSceneNode::CCameraSceneNode(ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position, const core::vector3df &lookat) :
		ICameraSceneNode(parent, mgr, id, position),
		BoundingBox(core::vector3df(0, 0, 0)), // Camera has no size. Still not sure if FLT_MAX might be the better variant
		Target(lookat), UpVector(0.0f, 1.0f, 0.0f), ZNear(1.0f), ZFar(3000.0f),
		InputReceiverEnabled(true), TargetAndRotationAreBound(false)
{
#ifdef _DEBUG
	setDebugName("CCameraSceneNode");
#endif

	// set default projection
	Fovy = core::PI / 2.5f; // Field of view, in radians.
	Aspect = 4.0f / 3.0f;   // Aspect ratio.

	const video::IVideoDriver *const d = mgr ? mgr->getVideoDriver() : 0;
	if (d) {
		if (d->getCurrentRenderTargetSize().Height)
			Aspect = (f32)d->getCurrentRenderTargetSize().Width /
					 (f32)d->getCurrentRenderTargetSize().Height;
	}

	ViewArea.setFarNearDistance(ZFar - ZNear);
	recalculateProjectionMatrix();
	recalculateViewArea();
}